

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphBuilder.cpp
# Opt level: O0

set<LockNode_*,_std::less<LockNode_*>,_std::allocator<LockNode_*>_> * __thiscall
GraphBuilder::getLocks(GraphBuilder *this)

{
  bool bVar1;
  reference pvVar2;
  long in_RSI;
  unordered_map<const_llvm::CallInst_*,_LockNode_*,_std::hash<const_llvm::CallInst_*>,_std::equal_to<const_llvm::CallInst_*>,_std::allocator<std::pair<const_llvm::CallInst_*const,_LockNode_*>_>_>
  *in_RDI;
  pair<std::_Rb_tree_const_iterator<LockNode_*>,_bool> pVar3;
  value_type iterator;
  const_iterator __end1;
  const_iterator __begin1;
  unordered_map<const_llvm::CallInst_*,_LockNode_*,_std::hash<const_llvm::CallInst_*>,_std::equal_to<const_llvm::CallInst_*>,_std::allocator<std::pair<const_llvm::CallInst_*const,_LockNode_*>_>_>
  *__range1;
  set<LockNode_*,_std::less<LockNode_*>,_std::allocator<LockNode_*>_> *locks;
  unordered_map<const_llvm::CallInst_*,_LockNode_*,_std::hash<const_llvm::CallInst_*>,_std::equal_to<const_llvm::CallInst_*>,_std::allocator<std::pair<const_llvm::CallInst_*const,_LockNode_*>_>_>
  *this_00;
  undefined1 in_stack_ffffffffffffffb8;
  undefined7 in_stack_ffffffffffffffb9;
  _Node_iterator_base<std::pair<const_llvm::CallInst_*const,_LockNode_*>,_false> local_30;
  _Node_iterator_base<std::pair<const_llvm::CallInst_*const,_LockNode_*>,_false> local_28;
  long local_20;
  undefined1 local_11;
  
  local_11 = 0;
  this_00 = in_RDI;
  std::set<LockNode_*,_std::less<LockNode_*>,_std::allocator<LockNode_*>_>::set
            ((set<LockNode_*,_std::less<LockNode_*>,_std::allocator<LockNode_*>_> *)0x193d2e);
  local_20 = in_RSI + 0x158;
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<const_llvm::CallInst_*,_LockNode_*,_std::hash<const_llvm::CallInst_*>,_std::equal_to<const_llvm::CallInst_*>,_std::allocator<std::pair<const_llvm::CallInst_*const,_LockNode_*>_>_>
       ::begin(in_RDI);
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<const_llvm::CallInst_*,_LockNode_*,_std::hash<const_llvm::CallInst_*>,_std::equal_to<const_llvm::CallInst_*>,_std::allocator<std::pair<const_llvm::CallInst_*const,_LockNode_*>_>_>
       ::end(in_RDI);
  while (bVar1 = std::__detail::operator!=(&local_28,&local_30), bVar1) {
    pvVar2 = std::__detail::
             _Node_const_iterator<std::pair<const_llvm::CallInst_*const,_LockNode_*>,_false,_false>
             ::operator*((_Node_const_iterator<std::pair<const_llvm::CallInst_*const,_LockNode_*>,_false,_false>
                          *)0x193d7b);
    pVar3 = std::set<LockNode_*,_std::less<LockNode_*>,_std::allocator<LockNode_*>_>::insert
                      ((set<LockNode_*,_std::less<LockNode_*>,_std::allocator<LockNode_*>_> *)
                       pvVar2->first,
                       (value_type *)CONCAT71(in_stack_ffffffffffffffb9,in_stack_ffffffffffffffb8));
    in_stack_ffffffffffffffb8 = pVar3.second;
    std::__detail::
    _Node_const_iterator<std::pair<const_llvm::CallInst_*const,_LockNode_*>,_false,_false>::
    operator++((_Node_const_iterator<std::pair<const_llvm::CallInst_*const,_LockNode_*>,_false,_false>
                *)this_00);
  }
  return (set<LockNode_*,_std::less<LockNode_*>,_std::allocator<LockNode_*>_> *)this_00;
}

Assistant:

std::set<LockNode *> GraphBuilder::getLocks() const {
    std::set<LockNode *> locks;
    for (auto iterator : llvmToLocks_) {
        locks.insert(iterator.second);
    }
    return locks;
}